

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

void mpi_montg_init(mbedtls_mpi_uint *mm,mbedtls_mpi *N)

{
  mbedtls_mpi_uint mVar1;
  uint local_2c;
  uint i;
  mbedtls_mpi_uint m0;
  mbedtls_mpi_uint x;
  mbedtls_mpi *N_local;
  mbedtls_mpi_uint *mm_local;
  
  mVar1 = *N->p;
  m0 = (mVar1 + 2 & 4) * 2 + mVar1;
  for (local_2c = 0x40; 7 < local_2c; local_2c = local_2c >> 1) {
    m0 = (2 - mVar1 * m0) * m0;
  }
  *mm = (m0 ^ 0xffffffffffffffff) + 1;
  return;
}

Assistant:

static void mpi_montg_init( mbedtls_mpi_uint *mm, const mbedtls_mpi *N )
{
    mbedtls_mpi_uint x, m0 = N->p[0];
    unsigned int i;

    x  = m0;
    x += ( ( m0 + 2 ) & 4 ) << 1;

    for( i = biL; i >= 8; i /= 2 )
        x *= ( 2 - ( m0 * x ) );

    *mm = ~x + 1;
}